

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

CEPlanet * CEPlanet::Mars(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Mars",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,1.52371243,9.7e-07);
  SetEccentricity(in_RDI,0.09336511,9.149e-05);
  SetInclination(in_RDI,1.85181869,-0.00724757,DEGREES);
  SetMeanLongitude(in_RDI,-4.56813164,19140.29934243,DEGREES);
  SetPerihelionLongitude(in_RDI,-23.91744784,0.45223625,DEGREES);
  SetAscendingNodeLongitude(in_RDI,49.71320984,-0.26852431,DEGREES);
  SetMeanRadius_m(in_RDI,3389900.0);
  SetAlbedo(in_RDI,0.15);
  SetMass_kg(in_RDI,6.4185e+23);
  local_40._M_dataplus._M_p = (pointer)0x4010000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Mars()
{
    CEPlanet mars("Mars", 0.0, 0.0) ;
    mars.SetSemiMajorAxis_AU(1.52371243, 0.00000097) ;
    mars.SetEccentricity(0.09336511, 0.00009149) ;
    mars.SetInclination(1.85181869, -0.00724757, CEAngleType::DEGREES) ;
    mars.SetMeanLongitude(-4.56813164, 19140.29934243, CEAngleType::DEGREES) ;
    mars.SetPerihelionLongitude(-23.91744784, 0.45223625, CEAngleType::DEGREES) ;
    mars.SetAscendingNodeLongitude(49.71320984, -0.26852431, CEAngleType::DEGREES) ;
    
    // Set planetary properties
    mars.SetMeanRadius_m(3389900.0) ;
    mars.SetAlbedo(0.150) ;
    mars.SetMass_kg(6.4185E23) ;
    
    // Set the sofa planet ID
    mars.SetSofaID(4) ;
    
    
    return mars ;
}